

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserDecorator.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserDecorator::ParseValue
          (PropertyParserDecorator *this,Property *property,String *decorator_string_value,
          ParameterMap *param_3)

{
  undefined8 uVar1;
  Property *pPVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
  *this_00;
  const_iterator cVar6;
  PropertyParserDecoratorData *pPVar7;
  PropertySpecification *this_01;
  BoxArea BVar8;
  char cVar9;
  pointer pbVar10;
  pointer pbVar11;
  allocator<char> local_1b1;
  DecoratorInstancer *local_1b0;
  StringList keywords;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_190;
  pointer local_170;
  StringList decorator_string_list;
  undefined1 local_148 [72];
  size_t local_100;
  size_type sStack_f8;
  BoxArea local_f0;
  Property *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  DecoratorDeclarationList decorators;
  String type;
  String shorthand;
  String local_50;
  
  if ((decorator_string_value->_M_string_length == 0) ||
     (bVar3 = ::std::operator==(decorator_string_value,"none"), bVar3)) {
    decorators.list.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorators.list.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Variant::Variant<std::shared_ptr<Rml::DecoratorDeclarationList_const>,void>
              ((Variant *)local_148,(shared_ptr<const_Rml::DecoratorDeclarationList> *)&decorators);
    Variant::operator=(&property->value,(Variant *)local_148);
    Variant::~Variant((Variant *)local_148);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &decorators.list.
                super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    property->unit = DECORATOR;
    bVar3 = true;
  }
  else {
    decorator_string_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorator_string_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    decorator_string_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    StringUtilities::ExpandString(&decorator_string_list,decorator_string_value,',','(',')',false);
    decorators.list.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    decorators.list.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    decorators.list.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    decorators.value._M_dataplus._M_p = (pointer)&decorators.value.field_2;
    decorators.value._M_string_length = 0;
    decorators.value.field_2._M_local_buf[0] = '\0';
    local_e8 = property;
    ::std::__cxx11::string::_M_assign((string *)&decorators.value);
    ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::reserve
              (&decorators.list,
               (long)decorator_string_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)decorator_string_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    bStack_190.field_2._8_8_ =
         decorator_string_list.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = decorator_string_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 != (pointer)bStack_190.field_2._8_8_; pbVar11 = pbVar11 + 1) {
      cVar9 = (char)pbVar11;
      uVar4 = ::std::__cxx11::string::find(cVar9,0x28);
      uVar5 = ::std::__cxx11::string::rfind(cVar9,0x29);
      local_1b0 = (DecoratorInstancer *)
                  CONCAT71(local_1b0._1_7_,uVar5 <= uVar4 || uVar5 == 0xffffffffffffffff);
      if (uVar5 <= uVar4 || uVar5 == 0xffffffffffffffff) {
        local_d8 = ::std::__cxx11::string::find(cVar9,0x20);
      }
      else {
        local_d8 = uVar5 + 1;
      }
      keywords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      keywords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      keywords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170 = pbVar11;
      local_e0 = uVar5;
      local_d0 = uVar4;
      if (local_d8 < pbVar11->_M_string_length) {
        ::std::__cxx11::string::substr((ulong)local_148,(ulong)pbVar11);
        StringUtilities::ExpandString(&keywords,(String *)local_148,' ');
        ::std::__cxx11::string::~string((string *)local_148);
      }
      pbVar11 = keywords.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      BVar8 = Auto;
      for (pbVar10 = keywords.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar11;
          pbVar10 = pbVar10 + 1) {
        if (pbVar10->_M_string_length != 0) {
          this_00 = (flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
                     *)ControlledLifetimeResource<Rml::PropertyParserDecoratorData>::operator->
                                 ((ControlledLifetimeResource<Rml::PropertyParserDecoratorData> *)
                                  &parser_data);
          ::std::__cxx11::string::string((string *)&local_50,(string *)pbVar10);
          StringUtilities::ToLower((String *)local_148,&local_50);
          cVar6 = itlib::
                  flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
                  ::find<std::__cxx11::string>
                            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_148);
          ::std::__cxx11::string::~string((string *)local_148);
          ::std::__cxx11::string::~string((string *)&local_50);
          pPVar7 = ControlledLifetimeResource<Rml::PropertyParserDecoratorData>::operator->
                             ((ControlledLifetimeResource<Rml::PropertyParserDecoratorData> *)
                              &parser_data);
          if (cVar6._M_current ==
              (pPVar7->area_keywords).m_container.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&keywords);
            goto LAB_002b60b1;
          }
          BVar8 = (cVar6._M_current)->second;
        }
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&keywords);
      pbVar11 = local_170;
      if ((char)local_1b0 == '\0') {
        ::std::__cxx11::string::substr((ulong)local_148,(ulong)local_170);
        StringUtilities::StripWhitespace(&type,(String *)local_148);
        ::std::__cxx11::string::~string((string *)local_148);
        local_1b0 = Factory::GetDecoratorInstancer(&type);
        if (local_1b0 == (DecoratorInstancer *)0x0) {
          Log::Message(LT_WARNING,"Decorator type \'%s\' not found.",type._M_dataplus._M_p);
LAB_002b617c:
          ::std::__cxx11::string::~string((string *)&type);
          goto LAB_002b60b1;
        }
        ::std::__cxx11::string::substr((ulong)&shorthand,(ulong)pbVar11);
        this_01 = EffectSpecification::GetPropertySpecification
                            (&local_1b0->super_EffectSpecification);
        PropertyDictionary::PropertyDictionary((PropertyDictionary *)&keywords);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_148,"decorator",&local_1b1);
        bVar3 = PropertySpecification::ParsePropertyDeclaration
                          (this_01,(PropertyDictionary *)&keywords,(String *)local_148,&shorthand);
        ::std::__cxx11::string::~string((string *)local_148);
        if (!bVar3) {
          StringUtilities::StripWhitespace((String *)local_148,&shorthand);
          uVar1 = local_148._8_8_;
          ::std::__cxx11::string::~string((string *)local_148);
          if (uVar1 != 0) {
            robin_hood::detail::
            Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                       *)&keywords);
            ::std::__cxx11::string::~string((string *)&shorthand);
            goto LAB_002b617c;
          }
        }
        PropertySpecification::SetPropertyDefaults(this_01,(PropertyDictionary *)&keywords);
        ::std::__cxx11::string::string((string *)local_148,(string *)&type);
        local_148._32_8_ = local_1b0;
        local_148._40_8_ = local_148 + 0x40;
        local_100 = 0;
        local_148._56_8_ = (pointer)0x0;
        local_148._64_8_ = (pointer)0x0;
        sStack_f8 = 0x20;
        local_148._48_8_ = local_148._40_8_;
        if (bStack_190._M_dataplus._M_p != (pointer)0x0) {
          local_148._40_8_ =
               keywords.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_148._48_8_ =
               keywords.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_148._56_8_ =
               keywords.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_148._64_8_ = bStack_190._M_dataplus._M_p;
          local_100 = bStack_190._M_string_length;
          sStack_f8 = bStack_190.field_2._M_allocated_capacity;
          keywords.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = &bStack_190;
          keywords.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bStack_190._M_dataplus._M_p = (pointer)0x0;
          bStack_190._M_string_length = 0;
          bStack_190.field_2._M_allocated_capacity = 0x20;
          keywords.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               keywords.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        local_f0 = BVar8;
        ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
        emplace_back<Rml::DecoratorDeclaration>(&decorators.list,(DecoratorDeclaration *)local_148);
        DecoratorDeclaration::~DecoratorDeclaration((DecoratorDeclaration *)local_148);
        robin_hood::detail::
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   *)&keywords);
        ::std::__cxx11::string::~string((string *)&shorthand);
        ::std::__cxx11::string::~string((string *)&type);
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_148,(ulong)local_170);
        local_148._32_8_ = (DecoratorInstancer *)0x0;
        PropertyDictionary::PropertyDictionary((PropertyDictionary *)(local_148 + 0x28));
        local_f0 = BVar8;
        ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
        emplace_back<Rml::DecoratorDeclaration>(&decorators.list,(DecoratorDeclaration *)local_148);
        DecoratorDeclaration::~DecoratorDeclaration((DecoratorDeclaration *)local_148);
      }
    }
    if (decorators.list.
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        decorators.list.
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_002b60b1:
      bVar3 = false;
    }
    else {
      ::std::make_shared<Rml::DecoratorDeclarationList,Rml::DecoratorDeclarationList>
                ((DecoratorDeclarationList *)&keywords);
      Variant::Variant<std::shared_ptr<Rml::DecoratorDeclarationList>,void>
                ((Variant *)local_148,(shared_ptr<Rml::DecoratorDeclarationList> *)&keywords);
      pPVar2 = local_e8;
      Variant::operator=(&local_e8->value,(Variant *)local_148);
      Variant::~Variant((Variant *)local_148);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &keywords.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      pPVar2->unit = DECORATOR;
      bVar3 = true;
    }
    DecoratorDeclarationList::~DecoratorDeclarationList(&decorators);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&decorator_string_list);
  }
  return bVar3;
}

Assistant:

bool PropertyParserDecorator::ParseValue(Property& property, const String& decorator_string_value, const ParameterMap& /*parameters*/) const
{
	// Decorators are declared as
	//   decorator: <decorator-value>[, <decorator-value> ...];
	// Where <decorator-value> is either a @decorator name:
	//   decorator: invader-theme-background <paint-area>?, ...;
	// or is an anonymous decorator with inline properties
	//   decorator: tiled-box( <shorthand properties> ) <paint-area>?, ...;
	// where <paint-area> is one of
	//   border-box, padding-box, content-box

	if (decorator_string_value.empty() || decorator_string_value == "none")
	{
		property.value = Variant(DecoratorsPtr());
		property.unit = Unit::DECORATOR;
		return true;
	}

	RMLUI_ZoneScoped;

	// Make sure we don't split inside the parenthesis since they may appear in decorator shorthands.
	StringList decorator_string_list;
	StringUtilities::ExpandString(decorator_string_list, decorator_string_value, ',', '(', ')');

	DecoratorDeclarationList decorators;
	decorators.value = decorator_string_value;
	decorators.list.reserve(decorator_string_list.size());

	// Get or instance each decorator in the comma-separated string list
	for (const String& decorator_string : decorator_string_list)
	{
		const size_t shorthand_open = decorator_string.find('(');
		const size_t shorthand_close = decorator_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);
		const size_t keywords_begin = (invalid_parenthesis ? decorator_string.find(' ') : shorthand_close + 1);

		// Look-up keywords for customized paint area.
		BoxArea paint_area = BoxArea::Auto;

		{
			StringList keywords;
			if (keywords_begin < decorator_string.size())
				StringUtilities::ExpandString(keywords, decorator_string.substr(keywords_begin), ' ');

			for (const String& keyword : keywords)
			{
				if (keyword.empty())
					continue;

				auto it = parser_data->area_keywords.find(StringUtilities::ToLower(keyword));
				if (it == parser_data->area_keywords.end())
					return false; // Bail out if we have an invalid keyword.

				paint_area = it->second;
			}
		}

		if (invalid_parenthesis)
		{
			// We found no parenthesis, that means the value must be a name of a @decorator rule.
			decorators.list.emplace_back(DecoratorDeclaration{decorator_string.substr(0, keywords_begin), nullptr, {}, paint_area});
		}
		else
		{
			// Since we have parentheses it must be an anonymous decorator with inline properties
			const String type = StringUtilities::StripWhitespace(decorator_string.substr(0, shorthand_open));

			// Check for valid decorator type
			DecoratorInstancer* instancer = Factory::GetDecoratorInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Decorator type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = decorator_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'decorator' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "decorator", shorthand))
			{
				// Empty values are allowed in decorators, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
					return false;
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			decorators.list.emplace_back(DecoratorDeclaration{type, instancer, std::move(properties), paint_area});
		}
	}

	if (decorators.list.empty())
		return false;

	property.value = Variant(MakeShared<DecoratorDeclarationList>(std::move(decorators)));
	property.unit = Unit::DECORATOR;

	return true;
}